

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

Expression *
slang::ast::DistExpression::fromSyntax
          (Compilation *comp,ExpressionOrDistSyntax *syntax,ASTContext *context)

{
  ulong uVar1;
  TokenKind TVar2;
  DistConstraintListSyntax *pDVar3;
  pointer pDVar4;
  ExpressionSyntax *pEVar5;
  DistWeightSyntax *pDVar6;
  Type *args;
  Expression *args_1;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  DistItemSyntax *pDVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DistExpression *expr;
  byte bVar11;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_t sVar12;
  ulong uVar13;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::DistExpression::DistItem,_4UL> items;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  DistItem local_188;
  undefined8 *local_168;
  ulong local_160;
  undefined8 local_158;
  undefined8 local_150 [5];
  ExpressionSyntax *local_128;
  pointer ppEStack_120;
  ExpressionSyntax *local_118;
  pointer ppEStack_110;
  undefined8 local_108;
  ExpressionSyntax local_100 [2];
  SourceRange local_d8;
  SmallVectorBase<slang::ast::DistExpression::DistItem> local_c8 [2];
  
  local_118 = local_100;
  ppEStack_110 = (pointer)0x0;
  local_108 = 5;
  pDVar3 = (syntax->distribution).ptr;
  if (pDVar3 == (DistConstraintListSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::DistConstraintListSyntax *>::get() const [T = slang::syntax::DistConstraintListSyntax *]"
              );
  }
  uVar13 = (pDVar3->items).elements.size_ + 1;
  if (1 < uVar13) {
    sVar12 = 0;
    do {
      pDVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::operator[]
                          (&pDVar3->items,sVar12);
      pDVar4 = (pointer)(pDVar10->range).ptr;
      if (pDVar4 == (pointer)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                  );
      }
      local_c8[0].data_ = pDVar4;
      SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
      emplace_back<slang::syntax::ExpressionSyntax_const*>
                ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&local_118,
                 (ExpressionSyntax **)local_c8);
      sVar12 = sVar12 + 1;
    } while (uVar13 >> 1 != sVar12);
  }
  local_168 = local_150;
  local_160 = 0;
  local_158 = 5;
  pEVar5 = (syntax->expr).ptr;
  if (pEVar5 == (ExpressionSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
              );
  }
  local_128 = local_118;
  ppEStack_120 = ppEStack_110;
  expressions_00.size_ = (size_type)&local_168;
  expressions_00.data_ = ppEStack_110;
  bVar8 = Expression::bindMembershipExpressions
                    ((Expression *)context,(ASTContext *)0x8b,EndOfFile,false,false,true,
                     SUB81(pEVar5,0),local_118,expressions_00,
                     (SmallVectorBase<const_slang::ast::Expression_*> *)
                     CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  local_c8[0].data_ = (pointer)local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 4;
  pDVar3 = (syntax->distribution).ptr;
  if (pDVar3 == (DistConstraintListSyntax *)0x0) {
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,
               "T slang::not_null<slang::syntax::DistConstraintListSyntax *>::get() const [T = slang::syntax::DistConstraintListSyntax *]"
              );
  }
  bVar11 = !bVar8;
  uVar13 = (pDVar3->items).elements.size_ + 1;
  src = extraout_RDX;
  if (1 < uVar13) {
    sVar12 = 0;
    do {
      pDVar10 = slang::syntax::SeparatedSyntaxList<slang::syntax::DistItemSyntax>::operator[]
                          (&pDVar3->items,sVar12);
      uVar1 = sVar12 + 1;
      if (local_160 <= uVar1) {
        assert::assertFailed
                  ("index < len",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                   ,0x196,
                   "reference slang::SmallVectorBase<const slang::ast::Expression *>::operator[](size_type) [T = const slang::ast::Expression *]"
                  );
      }
      local_188.value = (Expression *)local_168[sVar12 + 1];
      local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
      _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
           false;
      pDVar6 = pDVar10->weight;
      if (pDVar6 != (DistWeightSyntax *)0x0) {
        TVar2 = (pDVar6->op).kind;
        pEVar5 = (pDVar6->expr).ptr;
        if (pEVar5 == (ExpressionSyntax *)0x0) {
          assert::assertFailed
                    ("ptr",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                     ,0x26,
                     "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
                    );
        }
        iVar9 = Expression::bind((int)pEVar5,(sockaddr *)context,0);
        uVar7 = local_188.weight.
                super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
                _0_8_;
        local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.expr = (Expression *)CONCAT44(extraout_var,iVar9);
        local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.kind._1_3_ = 0;
        local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _M_value.kind._0_1_ = TVar2 == ColonSlash;
        local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_payload.
        _4_4_ = SUB84(uVar7,4);
        local_188.weight.super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::DistExpression::DistWeight>._M_engaged =
             true;
        bVar8 = ASTContext::requireIntegral
                          (context,local_188.weight.
                                   super__Optional_base<slang::ast::DistExpression::DistWeight,_true,_true>
                                   ._M_payload.
                                   super__Optional_payload_base<slang::ast::DistExpression::DistWeight>
                                   ._M_payload._M_value.expr);
        bVar11 = bVar11 | !bVar8;
      }
      SmallVectorBase<slang::ast::DistExpression::DistItem>::
      emplace_back<slang::ast::DistExpression::DistItem&>(local_c8,&local_188);
      src = extraout_RDX_00;
      sVar12 = uVar1;
    } while (uVar13 >> 1 != uVar1);
  }
  if (local_160 != 0) {
    args = comp->voidType;
    args_1 = (Expression *)*local_168;
    iVar9 = SmallVectorBase<slang::ast::DistExpression::DistItem>::copy
                      (local_c8,(EVP_PKEY_CTX *)comp,src);
    local_188.value = (Expression *)CONCAT44(extraout_var_00,iVar9);
    local_d8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    expr = BumpAllocator::
           emplace<slang::ast::DistExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::DistExpression::DistItem,18446744073709551615ul>,slang::SourceRange>
                     (&comp->super_BumpAllocator,args,args_1,
                      (span<slang::ast::DistExpression::DistItem,_18446744073709551615UL> *)
                      &local_188,&local_d8);
    if ((bVar11 & 1) != 0) {
      expr = (DistExpression *)Expression::badExpr(comp,&expr->super_Expression);
    }
    if (local_c8[0].data_ != (pointer)local_c8[0].firstElement) {
      free(local_c8[0].data_);
    }
    if (local_168 != local_150) {
      free(local_168);
    }
    if (local_118 != local_100) {
      free(local_118);
    }
    return &expr->super_Expression;
  }
  assert::assertFailed
            ("index < len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x196,
             "reference slang::SmallVectorBase<const slang::ast::Expression *>::operator[](size_type) [T = const slang::ast::Expression *]"
            );
}

Assistant:

Expression& DistExpression::fromSyntax(Compilation& comp, const ExpressionOrDistSyntax& syntax,
                                       const ASTContext& context) {
    SmallVector<const ExpressionSyntax*> expressions;
    for (auto item : syntax.distribution->items)
        expressions.push_back(item->range);

    SmallVector<const Expression*> bound;
    bool bad =
        !bindMembershipExpressions(context, TokenKind::DistKeyword, /* requireIntegral */ true,
                                   /* unwrapUnpacked */ false, /* allowTypeReferences */ false,
                                   /* allowOpenRange */ true, *syntax.expr, expressions, bound);

    SmallVector<DistItem, 4> items;
    size_t index = 1;
    for (auto item : syntax.distribution->items) {
        DistItem di{*bound[index++], {}};
        if (item->weight) {
            auto weightKind = item->weight->op.kind == TokenKind::ColonSlash ? DistWeight::PerRange
                                                                             : DistWeight::PerValue;
            auto& weightExpr = Expression::bind(*item->weight->expr, context);
            di.weight.emplace(DistWeight{weightKind, weightExpr});

            if (!context.requireIntegral(weightExpr))
                bad = true;
        }

        items.emplace_back(di);
    }

    auto result = comp.emplace<DistExpression>(comp.getVoidType(), *bound[0], items.copy(comp),
                                               syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    return *result;
}